

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

string * __thiscall
cs_impl::to_string_if<cs::callable,false>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,to_string_if<cs::callable,false> *this,callable *param_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  cxx_demangle_abi_cxx11_(&local_30,(cs_impl *)"cs::function",(char *)param_1);
  std::operator+(&local_50,"[",&local_30);
  std::operator+(__return_storage_ptr__,&local_50,"]");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(const T &)
		{
			return "[" + cxx_demangle(get_name_of_type<T>()) + "]";
		}